

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O1

void __thiscall DROPlayer::ScanInitBlock(DROPlayer *this)

{
  ulong *puVar1;
  ushort uVar2;
  uint uVar3;
  UINT32 UVar4;
  UINT8 *pUVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  ushort uVar9;
  ulong *puVar10;
  
  puVar10 = (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar1 = (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar8 = (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (puVar10 != puVar1) {
    memset(puVar10,0,(long)puVar1 - (long)puVar10);
    puVar10 = puVar1;
  }
  if (uVar8 != 0) {
    *puVar10 = *puVar10 & ~(0xffffffffffffffffU >> (-(char)uVar8 & 0x3fU));
  }
  this->_initOPL3Enable = '\0';
  uVar8 = (this->_fileHdr).dataOfs;
  uVar9 = (this->_fileHdr).verMajor;
  uVar3 = DataLoader_GetSize(this->_dLoad);
  if (uVar9 < 2) {
    bVar7 = 0;
    uVar9 = 0;
    if (uVar8 < uVar3) {
      do {
        pUVar5 = this->_fileData;
        bVar6 = pUVar5[uVar8];
        uVar3 = uVar8;
        if ((bVar6 & 0xfe) == 2) {
          do {
            bVar7 = bVar6;
            uVar8 = uVar3 + 1;
            UVar4 = DataLoader_GetSize(this->_dLoad);
            if (UVar4 <= uVar8) {
              bVar7 = bVar7 & 1;
              uVar8 = uVar3 + 1;
              goto LAB_0010d216;
            }
            pUVar5 = this->_fileData;
            bVar6 = pUVar5[uVar8];
            uVar3 = uVar8;
          } while ((bVar6 & 0xfe) == 2);
          bVar7 = bVar7 & 1;
        }
        uVar2 = CONCAT11(bVar7,bVar6);
        if (uVar2 < uVar9) break;
        puVar10 = (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar2 >> 6);
        *puVar10 = *puVar10 | 1L << (bVar6 & 0x3f);
        if (uVar2 == 0x105) {
          this->_initOPL3Enable = pUVar5[uVar8 + 1];
        }
        uVar8 = uVar8 + 2;
        UVar4 = DataLoader_GetSize(this->_dLoad);
        uVar9 = uVar2;
      } while (uVar8 < UVar4);
    }
LAB_0010d216:
    UVar4 = DataLoader_GetSize(this->_dLoad);
    uVar3 = uVar8;
    if (uVar8 < UVar4) {
      do {
        while( true ) {
          uVar8 = uVar3;
          pUVar5 = this->_fileData;
          bVar6 = pUVar5[uVar8];
          if (bVar6 < 2) goto LAB_0010d2c8;
          if ((bVar6 & 0xfe) == 2) break;
          if ((bVar6 == 4) && (pUVar5[uVar8 + 1] < 8)) goto LAB_0010d2c8;
          puVar10 = (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                    (ushort)(CONCAT11(bVar7,bVar6) >> 6);
          *puVar10 = *puVar10 | 1L << (bVar6 & 0x3f);
          if (CONCAT11(bVar7,bVar6) == 0x105) {
            this->_initOPL3Enable = pUVar5[uVar8 + 1];
          }
          uVar8 = uVar8 + 2;
          UVar4 = DataLoader_GetSize(this->_dLoad);
          uVar3 = uVar8;
          if (UVar4 <= uVar8) goto LAB_0010d2c8;
        }
        bVar7 = bVar6 & 1;
        UVar4 = DataLoader_GetSize(this->_dLoad);
        uVar3 = uVar8 + 1;
      } while (uVar8 + 1 < UVar4);
      uVar8 = uVar8 + 1;
    }
  }
  else {
    for (; uVar8 < uVar3; uVar8 = uVar8 + 2) {
      pUVar5 = this->_fileData;
      bVar7 = pUVar5[uVar8];
      if ((bVar7 == (this->_fileHdr).cmdDlyShort) || (bVar7 == (this->_fileHdr).cmdDlyLong)) break;
      if ((uint)(this->_fileHdr).regCmdCnt <= (bVar7 & 0x7f)) break;
      bVar6 = (this->_fileHdr).regCmdMap[bVar7 & 0x7f];
      uVar3 = (uint)bVar6 + (bVar7 & 0xffffff80) * 2;
      puVar10 = (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar3 >> 6);
      *puVar10 = *puVar10 | 1L << (bVar6 & 0x3f);
      if (uVar3 == 0x105) {
        this->_initOPL3Enable = pUVar5[uVar8 + 1];
      }
      uVar3 = DataLoader_GetSize(this->_dLoad);
    }
  }
LAB_0010d2c8:
  this->_initBlkEndOfs = uVar8;
  return;
}

Assistant:

void DROPlayer::ScanInitBlock(void)
{
	// Scan initialization block of the DRO in order to be able to apply special fixes.
	// Fixes like:
	//	- DualOPL2 vs. OPL3 detection (because DOSBox sets hwType to DualOPL2 more often that it should)
	//	- [DRO v1] detect size of initialization block (for filtering out unescaped writes to register 01/04)
	UINT32 filePos;
	UINT8 curCmd;
	UINT8 selPort;
	UINT16 curReg;
	UINT16 lastReg;
	
	std::fill(_initRegSet.begin(), _initRegSet.end(), false);
	_initOPL3Enable = 0x00;
	
	filePos = _fileHdr.dataOfs;
	if (_fileHdr.verMajor < 2)
	{
		selPort = 0;
		lastReg = 0x000;
		// The file begins with a register dump with increasing register numbers.
		while(filePos < DataLoader_GetSize(_dLoad))
		{
			curCmd = _fileData[filePos];
			if (curCmd == 0x02 || curCmd == 0x03)
			{
				// make an exception for the chip select commands
				selPort = curCmd & 0x01;
				filePos ++;
				continue;
			}
			
			curReg = (selPort << 8) | (curCmd << 0);
			if (curReg < lastReg)
				break;
			
			_initRegSet[curReg] = true;
			if (curReg == 0x105)
				_initOPL3Enable = _fileData[filePos + 0x01];
			lastReg = curReg;
			filePos += 0x02;
		}
		while(filePos < DataLoader_GetSize(_dLoad))
		{
			curCmd = _fileData[filePos];
			
			if (curCmd == 0x00 || curCmd == 0x01)
				break;	// delay command - stop scanning
			if (curCmd == 0x02 || curCmd == 0x03)
			{
				selPort = curCmd & 0x01;
				filePos ++;
				continue;
			}
			if (curCmd == 0x04)
			{
				if (_fileData[filePos + 0x01] < 0x08)
					break;	// properly escaped command - stop scanning
			}
			curReg = (selPort << 8) | (curCmd << 0);
			_initRegSet[curReg] = true;
			if (curReg == 0x105)
				_initOPL3Enable = _fileData[filePos + 0x01];
			filePos += 0x02;
		}
	}
	else //if (_fileHdr.verMajor == 2)
	{
		lastReg = 0x000;
		// The file begins with a register dump with increasing register numbers.
		while(filePos < DataLoader_GetSize(_dLoad))
		{
			curCmd = _fileData[filePos];
			if (curCmd == _fileHdr.cmdDlyShort || curCmd == _fileHdr.cmdDlyLong)
				break;
			
			if ((curCmd & 0x7F) >= _fileHdr.regCmdCnt)
				break;
			curReg = ((curCmd & 0x80) << 1) | (_fileHdr.regCmdMap[curCmd & 0x7F] << 0);
			_initRegSet[curReg] = true;
			if (curReg == 0x105)
				_initOPL3Enable = _fileData[filePos + 0x01];
			filePos += 0x02;
		}
	}
	_initBlkEndOfs = filePos;
	
	return;
}